

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ConvertRemoteHandleToLocal
          (CSharedMemoryObjectManager *this,CPalThread *pthr,RHANDLE rhRemote,HANDLE *phLocal)

{
  HANDLE *ppVVar1;
  int iVar2;
  HANDLE *ppVVar3;
  undefined1 local_70 [8];
  CObjectAttributes oa;
  CObjectType *pot;
  PLIST_ENTRY ple;
  PLIST_ENTRY pleObjectList;
  CSharedMemoryObject *pshmobj;
  SHMObjData *psmod;
  HANDLE *ppVStack_28;
  PAL_ERROR palError;
  HANDLE *phLocal_local;
  RHANDLE rhRemote_local;
  CPalThread *pthr_local;
  CSharedMemoryObjectManager *this_local;
  
  psmod._4_4_ = 0;
  pleObjectList = (PLIST_ENTRY)0x0;
  ppVStack_28 = phLocal;
  phLocal_local = (HANDLE *)rhRemote;
  rhRemote_local = (RHANDLE)pthr;
  pthr_local = (CPalThread *)this;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ConvertRemoteHandleToLocal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x524);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (ppVStack_28 == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ConvertRemoteHandleToLocal",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x525);
    fprintf(_stderr,"Expression: NULL != phLocal\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if ((phLocal_local == (HANDLE *)0x0) || (phLocal_local == (HANDLE *)&DAT_ffffffffffffffff)) {
    psmod._4_4_ = 6;
    goto LAB_00247304;
  }
  InternalEnterCriticalSection((CPalThread *)rhRemote_local,&this->m_csListLock);
  SHMLock();
  pshmobj = (CSharedMemoryObject *)SHMPtrToPtr((SHMPTR)phLocal_local);
  if (pshmobj == (CSharedMemoryObject *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    psmod._4_4_ = 6;
  }
  else {
    if ((pshmobj->super_CPalObjectBase).m_oa.sObjectName.m_dwMaxLength == 0) {
      ple = &this->m_leAnonymousObjects;
    }
    else {
      ple = &this->m_leNamedObjects;
    }
    for (pot = (CObjectType *)ple->Flink; pot != (CObjectType *)ple; pot = *(CObjectType **)pot) {
      pleObjectList = (PLIST_ENTRY)CSharedMemoryObject::GetObjectFromListLink((PLIST_ENTRY)pot);
      iVar2 = (*(((CSharedMemoryObject *)pleObjectList)->super_CPalObjectBase).super_IPalObject.
                _vptr_IPalObject[9])();
      ppVVar1 = phLocal_local;
      if ((iVar2 == 1) &&
         (ppVVar3 = (HANDLE *)
                    CSharedMemoryObject::GetShmObjData((CSharedMemoryObject *)pleObjectList),
         ppVVar1 == ppVVar3)) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        (pshmobj->super_CPalObjectBase).m_oa.sObjectName.m_dwStringLength =
             (pshmobj->super_CPalObjectBase).m_oa.sObjectName.m_dwStringLength - 1;
        if ((int)(pshmobj->super_CPalObjectBase).m_oa.sObjectName.m_dwStringLength < 1) {
          fprintf(_stderr,"] %s %s:%d","ConvertRemoteHandleToLocal",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,0x565);
          fprintf(_stderr,"Expression: 0 < psmod->lProcessRefCount\n");
        }
        (*(code *)pleObjectList->Flink[3].Blink)();
        break;
      }
      pleObjectList = (PLIST_ENTRY)0x0;
    }
    if (pleObjectList == (PLIST_ENTRY)0x0) {
      CObjectAttributes::CObjectAttributes((CObjectAttributes *)local_70);
      oa.pSecurityAttributes =
           (LPSECURITY_ATTRIBUTES)
           CObjectType::GetObjectTypeById
                     (*(PalObjectTypeId *)&(pshmobj->super_CPalObjectBase).m_oa.pSecurityAttributes)
      ;
      if ((CObjectType *)oa.pSecurityAttributes == (CObjectType *)0x0) {
        fprintf(_stderr,"] %s %s:%d","ConvertRemoteHandleToLocal",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                ,0x580);
        fprintf(_stderr,"Invalid object type ID in shared memory info\n");
      }
      else {
        psmod._4_4_ = ImportSharedObjectIntoProcess
                                (this,(CPalThread *)rhRemote_local,
                                 (CObjectType *)oa.pSecurityAttributes,(CObjectAttributes *)local_70
                                 ,(SHMPTR)phLocal_local,(SHMObjData *)pshmobj,false,
                                 (CSharedMemoryObject **)&pleObjectList);
        if (psmod._4_4_ == 0) {
          psmod._4_4_ = 0;
          goto LAB_002472c6;
        }
      }
    }
    else {
LAB_002472c6:
      psmod._4_4_ = (*(this->super_IPalObjectManager)._vptr_IPalObjectManager[3])
                              (this,rhRemote_local,pleObjectList,0,0,0,ppVStack_28);
    }
  }
  SHMRelease();
  InternalLeaveCriticalSection((CPalThread *)rhRemote_local,&this->m_csListLock);
LAB_00247304:
  if (pleObjectList != (PLIST_ENTRY)0x0) {
    (*(code *)pleObjectList->Flink[4].Flink)(pleObjectList,rhRemote_local);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return psmod._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ConvertRemoteHandleToLocal(
    CPalThread *pthr,
    RHANDLE rhRemote,
    HANDLE *phLocal
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMObjData *psmod;
    CSharedMemoryObject *pshmobj = NULL;
    PLIST_ENTRY pleObjectList;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != phLocal);

    ENTRY("CSharedMemoryObjectManager::ConvertRemoteHandleToLocal "
        "(this=%p, pthr=%p, rhRemote=%p, phLocal=%p)\n",
        this,
        pthr,
        rhRemote,
        phLocal
        );

    if (rhRemote == NULL || rhRemote == INVALID_HANDLE_VALUE)
    {
        palError = ERROR_INVALID_HANDLE;
        goto ConvertRemoteHandleToLocalExitNoLockRelease;
    }

    InternalEnterCriticalSection(pthr, &m_csListLock);
    SHMLock();

    //
    // The remote handle is really a shared memory pointer to the
    // SHMObjData for the object.
    //

    psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, reinterpret_cast<SHMPTR>(rhRemote));
    if (NULL == psmod)
    {
        ERROR("Invalid remote handle\n");
        palError = ERROR_INVALID_HANDLE;
        goto ConvertRemoteHandleToLocalExit;
    }

    //
    // Check to see if a local reference for this object already
    // exists
    //

    if (0 != psmod->dwNameLength)
    {
        pleObjectList = &m_leNamedObjects;
    }
    else
    {
        pleObjectList = &m_leAnonymousObjects;
    }

    for (PLIST_ENTRY ple = pleObjectList->Flink;
         ple != pleObjectList;
         ple = ple->Flink)
    {
        pshmobj = CSharedMemoryObject::GetObjectFromListLink(ple);

        if (SharedObject == pshmobj->GetObjectDomain()
            && reinterpret_cast<SHMPTR>(rhRemote) == pshmobj->GetShmObjData())
        {
            TRACE("Object for remote handle already present in this process\n");
            
            //
            // PAL_LocalHandleToRemote bumped up the process refcount on the
            // object. Since this process already had a reference to the object
            // we need to decrement that reference now...
            //

            psmod->lProcessRefCount -= 1;
            _ASSERTE(0 < psmod->lProcessRefCount);

            //
            // We also need to add a reference to the object (since ReleaseReference
            // gets called below)
            //

            pshmobj->AddReference();

            break;
        }

        pshmobj = NULL;
    }

    if (NULL == pshmobj)
    {
        CObjectType *pot;
        CObjectAttributes oa;
        
        //
        // Get the local instance of the CObjectType
        //
        
        pot = CObjectType::GetObjectTypeById(psmod->eTypeId);
        if (NULL == pot)
        {
            ASSERT("Invalid object type ID in shared memory info\n");
            goto ConvertRemoteHandleToLocalExit;
        }
        
        //
        // Create the local state for the shared object
        //

        palError = ImportSharedObjectIntoProcess(
            pthr,
            pot,
            &oa,
            reinterpret_cast<SHMPTR>(rhRemote),
            psmod,
            FALSE,
            &pshmobj
            );

        if (NO_ERROR != palError)
        {
            goto ConvertRemoteHandleToLocalExit;
        }        
    }

    //
    // Finally, allocate a local handle for the object
    //

    palError = ObtainHandleForObject(
        pthr,
        pshmobj,
        0,
        FALSE,
        NULL,
        phLocal
        );
        
ConvertRemoteHandleToLocalExit:

    SHMRelease();
    InternalLeaveCriticalSection(pthr, &m_csListLock);

ConvertRemoteHandleToLocalExitNoLockRelease:

    if (NULL != pshmobj)
    {
        pshmobj->ReleaseReference(pthr);
    }

    LOGEXIT("CSharedMemoryObjectManager::ConvertRemoteHandleToLocal returns %d\n", palError);

    return palError;
}